

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O2

long __thiscall glcts::anon_unknown_0::UniformSimple::Run(UniformSimple *this)

{
  CallLogWrapper *this_00;
  long lVar1;
  GLuint program;
  uint uVar2;
  mapped_type *pmVar3;
  long error;
  allocator<char> local_139;
  GLenum props [13];
  char *local_f8;
  undefined4 local_f0;
  undefined4 local_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined8 local_dc;
  undefined8 uStack_d4;
  undefined4 local_cc;
  GLint local_c8;
  key_type local_b8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indices;
  undefined1 local_68 [36];
  undefined8 uStack_44;
  undefined4 local_3c;
  GLint local_38;
  
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x15])(props,this);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x16])(&local_f8,this);
  program = PIQBase::CreateProgram(&this->super_PIQBase,(char *)props._0_8_,local_f8,false);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)props);
  this_00 = &(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glBindAttribLocation(this_00,program,0,"position");
  PIQBase::LinkProgram(&this->super_PIQBase,program);
  error = 0;
  uVar2 = (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x14])
                    (this,(ulong)program,0x8b86);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd])
            (this,(ulong)program,0x92e1,0x92f5,(ulong)uVar2,&error);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd])
            (this,(ulong)program,0x92e1,0x92f6,8,&error);
  indices._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &indices._M_t._M_impl.super__Rb_tree_header._M_header;
  indices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  indices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  indices._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       indices._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props,"repos",(allocator<char> *)&local_f8);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)program,0x92e1,&indices,props,&error);
  std::__cxx11::string::~string((string *)props);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props,"recolor",(allocator<char> *)&local_f8);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)program,0x92e1,&indices,props,&error);
  std::__cxx11::string::~string((string *)props);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props,"repos",(allocator<char> *)local_68);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,(key_type *)props);
  uVar2 = *pmVar3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"repos",(allocator<char> *)&local_b8);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)program,0x92e1,(ulong)uVar2,&local_f8,&error);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)props);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props,"recolor",(allocator<char> *)local_68);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,(key_type *)props);
  uVar2 = *pmVar3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"recolor",(allocator<char> *)&local_b8);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)program,0x92e1,(ulong)uVar2,&local_f8,&error);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)props);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props,"repos",(allocator<char> *)&local_f8);
  uVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"repos");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x11])
            (this,(ulong)program,0x92e1,props,(ulong)uVar2,&error);
  std::__cxx11::string::~string((string *)props);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props,"recolor",(allocator<char> *)&local_f8);
  uVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"recolor");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x11])
            (this,(ulong)program,0x92e1,props,(ulong)uVar2,&error);
  std::__cxx11::string::~string((string *)props);
  props[8] = 0x9301;
  props[9] = 0x930b;
  props[10] = 0x930a;
  props[0xb] = 0x9306;
  props[4] = 0x92fd;
  props[5] = 0x92fe;
  props[6] = 0x92ff;
  props[7] = 0x9300;
  props[0] = 0x92f9;
  props[1] = 0x92fa;
  props[2] = 0x92fb;
  props[3] = 0x92fc;
  props[0xc] = 0x930e;
  local_f8 = (char *)0x8b5200000006;
  local_f0 = 1;
  local_ec = 0xffffffff;
  uStack_e8 = 0xffffffff;
  uStack_e4 = 0xffffffff;
  uStack_e0 = 0xffffffff;
  local_dc = 0xffffffff00000000;
  uStack_d4 = 0;
  local_cc = local_f0;
  local_c8 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"repos");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_68,"repos",(allocator<char> *)&local_b8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,(key_type *)local_68);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e1,(ulong)*pmVar3,0xd,props,0xd,(allocator<char> *)&local_f8,
             &error);
  std::__cxx11::string::~string((string *)local_68);
  local_68._0_8_ = (pointer)0x8b5200000008;
  local_68._8_4_ = 1;
  local_68._12_4_ = 0xffffffff;
  local_68._16_4_ = 0xffffffff;
  local_68._20_4_ = 0xffffffff;
  local_68._24_4_ = 0xffffffff;
  local_68._28_8_ = 0xffffffff00000000;
  uStack_44 = 0x100000000;
  local_3c = 0;
  local_38 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"recolor");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"recolor",&local_139);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,&local_b8);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e1,(ulong)*pmVar3,0xd,props,0xd,(string *)local_68,&error);
  std::__cxx11::string::~string((string *)&local_b8);
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  lVar1 = error;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&indices._M_t);
  return lVar1;
}

Assistant:

virtual long Run()
	{
		GLuint program = CreateProgram(VertexShader().c_str(), FragmentShader().c_str(), false);
		glBindAttribLocation(program, 0, "position");
		LinkProgram(program);

		long error = NO_ERROR;

		VerifyGetProgramInterfaceiv(program, GL_UNIFORM, GL_ACTIVE_RESOURCES,
									GetProgramivRetValue(program, GL_ACTIVE_UNIFORMS), error);
		VerifyGetProgramInterfaceiv(program, GL_UNIFORM, GL_MAX_NAME_LENGTH, 8, error);

		std::map<std::string, GLuint> indices;
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indices, "repos", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indices, "recolor", error);

		VerifyGetProgramResourceName(program, GL_UNIFORM, indices["repos"], "repos", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indices["recolor"], "recolor", error);

		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "repos", glGetUniformLocation(program, "repos"), error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "recolor", glGetUniformLocation(program, "recolor"),
										 error);

		GLenum props[] = { GL_NAME_LENGTH,
						   GL_TYPE,
						   GL_ARRAY_SIZE,
						   GL_OFFSET,
						   GL_BLOCK_INDEX,
						   GL_ARRAY_STRIDE,
						   GL_MATRIX_STRIDE,
						   GL_IS_ROW_MAJOR,
						   GL_ATOMIC_COUNTER_BUFFER_INDEX,
						   GL_REFERENCED_BY_COMPUTE_SHADER,
						   GL_REFERENCED_BY_FRAGMENT_SHADER,
						   GL_REFERENCED_BY_VERTEX_SHADER,
						   GL_LOCATION };
		GLint expected[] = { 6, 35666, 1, -1, -1, -1, -1, 0, -1, 0, 0, 1, glGetUniformLocation(program, "repos") };
		VerifyGetProgramResourceiv(program, GL_UNIFORM, indices["repos"], 13, props, 13, expected, error);

		GLint expected2[] = { 8, 35666, 1, -1, -1, -1, -1, 0, -1, 0, 1, 0, glGetUniformLocation(program, "recolor") };
		VerifyGetProgramResourceiv(program, GL_UNIFORM, indices["recolor"], 13, props, 13, expected2, error);

		glDeleteProgram(program);
		return error;
	}